

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O1

void UnityAssertEqualMemory
               (void *expected,void *actual,_UU32 length,_UU32 num_elements,char *msg,
               _U_UINT lineNumber)

{
  int iVar1;
  _U_UINT number;
  _UU32 _Var2;
  
  if (Unity.CurrentTestIgnored == 0 && Unity.CurrentTestFailed == 0) {
    if ((length == 0) || (num_elements == 0)) {
      UnityTestResultsFailBegin(lineNumber);
      UnityPrint(" You Asked Me To Compare Nothing, Which Was Pointless.");
LAB_00103a83:
      UnityAddMsgIfSpecified(msg);
      Unity.CurrentTestFailed = 1;
      longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
    }
    iVar1 = UnityCheckArraysForNull(expected,actual,lineNumber,msg);
    _Var2 = num_elements;
    if (iVar1 == 0) {
      do {
        if (length != 0) {
          number = 0;
          do {
            if (*expected != *actual) {
              UnityTestResultsFailBegin(lineNumber);
              UnityPrint(" Memory Mismatch.");
              if (num_elements != 1) {
                UnityPrint(" Element ");
                UnityPrintNumberUnsigned((ulong)(num_elements - _Var2));
              }
              UnityPrint(" Byte ");
              UnityPrintNumberUnsigned(number);
              UnityPrint(" Expected ");
              UnityPrintNumberByStyle((ulong)*expected,UNITY_DISPLAY_STYLE_HEX8);
              UnityPrint(" Was ");
              UnityPrintNumberByStyle((ulong)*actual,UNITY_DISPLAY_STYLE_HEX8);
              goto LAB_00103a83;
            }
            expected = (void *)((long)expected + 1);
            actual = (void *)((long)actual + 1);
            number = number + 1;
          } while (length != (_UU32)number);
        }
        _Var2 = _Var2 - 1;
      } while (_Var2 != 0);
    }
  }
  return;
}

Assistant:

void UnityAssertEqualMemory( UNITY_INTERNAL_PTR expected,
                             UNITY_INTERNAL_PTR actual,
                             const _UU32 length,
                             const _UU32 num_elements,
                             const char* msg,
                             const UNITY_LINE_TYPE lineNumber)
{
    UNITY_PTR_ATTRIBUTE const unsigned char* ptr_exp = (UNITY_PTR_ATTRIBUTE const unsigned char*)expected;
    UNITY_PTR_ATTRIBUTE const unsigned char* ptr_act = (UNITY_PTR_ATTRIBUTE const unsigned char*)actual;
    _UU32 elements = num_elements;
    _UU32 bytes;

    UNITY_SKIP_EXECUTION;

    if ((elements == 0) || (length == 0))
    {
        UnityPrintPointlessAndBail();
    }

    if (UnityCheckArraysForNull((UNITY_INTERNAL_PTR)expected, (UNITY_INTERNAL_PTR)actual, lineNumber, msg) == 1)
        return;

    while (elements--)
    {
        bytes = length;
        while (bytes--)
        {
            if (*ptr_exp != *ptr_act)
            {
                UnityTestResultsFailBegin(lineNumber);
                UnityPrint(UnityStrMemory);
                if (num_elements > 1)
                {
                    UnityPrint(UnityStrElement);
                    UnityPrintNumberUnsigned(num_elements - elements - 1);
                }
                UnityPrint(UnityStrByte);
                UnityPrintNumberUnsigned(length - bytes - 1);
                UnityPrint(UnityStrExpected);
                UnityPrintNumberByStyle(*ptr_exp, UNITY_DISPLAY_STYLE_HEX8);
                UnityPrint(UnityStrWas);
                UnityPrintNumberByStyle(*ptr_act, UNITY_DISPLAY_STYLE_HEX8);
                UnityAddMsgIfSpecified(msg);
                UNITY_FAIL_AND_BAIL;
            }
            ptr_exp = (UNITY_INTERNAL_PTR)((_UP)ptr_exp + 1);
            ptr_act = (UNITY_INTERNAL_PTR)((_UP)ptr_act + 1);
        }
    }
}